

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

int __thiscall Shortcut_Button::handle(Shortcut_Button *this,int e)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  Shortcut_Button *pSVar6;
  int r;
  int c;
  int v;
  int e_local;
  Shortcut_Button *this_local;
  
  Fl_Widget::when((Fl_Widget *)this,'\0');
  Fl_Widget::type((Fl_Widget *)this,'\x01');
  if (e == 8) {
    cVar1 = Fl_Button::value(&this->super_Fl_Button);
    if (cVar1 == '\0') {
      this_local._4_4_ = 0;
    }
    else {
      pcVar5 = Fl::event_text();
      r = (int)*pcVar5;
      if (((r < 0x21) || (0x7e < r)) && ((r < 0xa1 || (0xff < r)))) {
        uVar3 = Fl::event_state();
        uVar4 = Fl::event_key();
        r = uVar3 & 0x4d0000 | uVar4;
        if ((r == 0xff08) && (this->svalue != 0)) {
          r = 0;
        }
      }
      else {
        iVar2 = isupper(r);
        if (iVar2 != 0) {
          uVar3 = tolower(r);
          r = uVar3 | 0x10000;
        }
        uVar3 = Fl::event_state();
        r = r | uVar3 & 0x4c0000;
      }
      if (r != this->svalue) {
        this->svalue = r;
        Fl_Widget::set_changed((Fl_Widget *)this);
        Fl_Widget::redraw((Fl_Widget *)this);
        Fl_Widget::do_callback((Fl_Widget *)this);
      }
      this_local._4_4_ = 1;
    }
  }
  else if (e == 7) {
    uVar3 = Fl_Widget::changed((Fl_Widget *)this);
    Fl_Button::value(&this->super_Fl_Button,0);
    if (uVar3 != 0) {
      Fl_Widget::set_changed((Fl_Widget *)this);
    }
    this_local._4_4_ = 1;
  }
  else if (e == 6) {
    cVar1 = Fl_Button::value(&this->super_Fl_Button);
    this_local._4_4_ = (int)cVar1;
  }
  else {
    this_local._4_4_ = Fl_Button::handle(&this->super_Fl_Button,e);
    if (((e == 2) && (cVar1 = Fl_Button::value(&this->super_Fl_Button), cVar1 != '\0')) &&
       (pSVar6 = (Shortcut_Button *)Fl::focus(), pSVar6 != this)) {
      Fl_Widget::take_focus((Fl_Widget *)this);
    }
  }
  return this_local._4_4_;
}

Assistant:

int Shortcut_Button::handle(int e) {
  when(0); type(FL_TOGGLE_BUTTON);
  if (e == FL_KEYBOARD) {
    if (!value()) return 0;
    int v = Fl::event_text()[0];
    if ( (v > 32 && v < 0x7f) || (v > 0xa0 && v <= 0xff) ) {
      if (isupper(v)) {
        v = tolower(v);
        v |= FL_SHIFT;
      }
      v = v | (Fl::event_state()&(FL_META|FL_ALT|FL_CTRL));
    } else {
      v = (Fl::event_state()&(FL_META|FL_ALT|FL_CTRL|FL_SHIFT)) | Fl::event_key();
      if (v == FL_BackSpace && svalue) v = 0;
    }
    if (v != svalue) {svalue = v; set_changed(); redraw(); do_callback(); }
    return 1;
  } else if (e == FL_UNFOCUS) {
    int c = changed(); value(0); if (c) set_changed();
    return 1;
  } else if (e == FL_FOCUS) {
    return value();
  } else {
    int r = Fl_Button::handle(e);
    if (e == FL_RELEASE && value() && Fl::focus() != this) take_focus();
    return r;
  }
}